

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O0

size_t __thiscall
SGParser::BacktrackingTokenStream<SGParser::Generator::StdGrammarToken>::GetBufferedLength
          (BacktrackingTokenStream<SGParser::Generator::StdGrammarToken> *this,size_t markerIndex)

{
  bool bVar1;
  _Self local_30;
  _Self local_28;
  size_t local_20;
  size_t markerIndex_local;
  BacktrackingTokenStream<SGParser::Generator::StdGrammarToken> *this_local;
  
  local_20 = markerIndex;
  markerIndex_local = (size_t)this;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::StdGrammarToken>::StreamBlock_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::StdGrammarToken>::StreamBlock_*>_>_>
       ::find(&this->Markers,&local_20);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::StdGrammarToken>::StreamBlock_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_SGParser::BacktrackingTokenStream<SGParser::Generator::StdGrammarToken>::StreamBlock_*>_>_>
       ::end(&this->Markers);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    this_local = (BacktrackingTokenStream<SGParser::Generator::StdGrammarToken> *)0x0;
  }
  else {
    this_local = (BacktrackingTokenStream<SGParser::Generator::StdGrammarToken> *)
                 (this->Pos - local_20);
  }
  return (size_t)this_local;
}

Assistant:

size_t BacktrackingTokenStream<Token>::GetBufferedLength(size_t markerIndex) const {
    // If not found, we fail
    if (Markers.find(markerIndex) == Markers.end())
        return 0u;
    return Pos - markerIndex;
}